

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall glslang::TParseContext::variableCheck(TParseContext *this,TIntermTyped **nodePtr)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar4;
  size_t s;
  char *pcVar5;
  size_type sVar6;
  TVariable *pTVar7;
  TString *name;
  TSourceLoc *pTVar8;
  TIntermSymbol *pTVar9;
  long lVar10;
  TType local_c8;
  TVariable *local_30;
  TVariable *fakeVariable;
  char *extraInfoFormat;
  TIntermSymbol *symbol;
  TIntermTyped **nodePtr_local;
  TParseContext *this_local;
  
  symbol = (TIntermSymbol *)nodePtr;
  nodePtr_local = (TIntermTyped **)this;
  iVar2 = (*((*nodePtr)->super_TIntermNode)._vptr_TIntermNode[0xc])();
  extraInfoFormat = (char *)CONCAT44(extraout_var,iVar2);
  if ((long *)extraInfoFormat == (long *)0x0) {
    return;
  }
  plVar3 = (long *)(**(code **)(*(long *)extraInfoFormat + 0xf0))();
  iVar2 = (**(code **)(*plVar3 + 0x38))();
  if (iVar2 != 0) {
    lVar10 = (**(code **)(*(long *)extraInfoFormat + 0x108))();
    if ((*(uint *)(lVar10 + 8) & 0x7f) != 0x1b) {
      return;
    }
    pTVar8 = (TSourceLoc *)(*(code *)**(undefined8 **)extraInfoFormat)();
    TParseVersions::profileRequires
              ((TParseVersions *)this,pTVar8,1,0x78,(char *)0x0,"gl_PointCoord");
    return;
  }
  fakeVariable = (TVariable *)0xe30c4c;
  if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan != 0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (**(code **)(*(long *)extraInfoFormat + 400))();
    bVar1 = std::operator==(pbVar4,"gl_VertexID");
    if (bVar1) {
      fakeVariable = (TVariable *)anon_var_dwarf_ca34da;
      goto LAB_0074fabd;
    }
  }
  if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan != 0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (**(code **)(*(long *)extraInfoFormat + 400))();
    bVar1 = std::operator==(pbVar4,"gl_InstanceID");
    if (bVar1) {
      fakeVariable = (TVariable *)anon_var_dwarf_ca34f2;
    }
  }
LAB_0074fabd:
  s = (*(code *)**(undefined8 **)extraInfoFormat)();
  pbVar4 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
           (**(code **)(*(long *)extraInfoFormat + 400))();
  pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str(pbVar4);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,s,"undeclared identifier",pcVar5,fakeVariable);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
           (**(code **)(*(long *)extraInfoFormat + 400))();
  sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          size(pbVar4);
  if (sVar6 != 0) {
    pTVar7 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,s);
    name = (TString *)(**(code **)(*(long *)extraInfoFormat + 400))();
    TType::TType(&local_c8,EbtFloat,EvqTemporary,1,0,0,false);
    TVariable::TVariable(pTVar7,name,&local_c8,false);
    TType::~TType(&local_c8);
    local_30 = pTVar7;
    TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar7);
    pTVar7 = local_30;
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar8 = (TSourceLoc *)(*(code *)**(undefined8 **)extraInfoFormat)();
    pTVar9 = TIntermediate::addSymbol(this_00,pTVar7,pTVar8);
    (symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode = (_func_int **)pTVar9;
  }
  return;
}

Assistant:

void TParseContext::variableCheck(TIntermTyped*& nodePtr)
{
    TIntermSymbol* symbol = nodePtr->getAsSymbolNode();
    if (! symbol)
        return;

    if (symbol->getType().getBasicType() == EbtVoid) {
        const char *extraInfoFormat = "";
        if (spvVersion.vulkan != 0 && symbol->getName() == "gl_VertexID") {
          extraInfoFormat = "(Did you mean gl_VertexIndex?)";
        } else if (spvVersion.vulkan != 0 && symbol->getName() == "gl_InstanceID") {
          extraInfoFormat = "(Did you mean gl_InstanceIndex?)";
        }
        error(symbol->getLoc(), "undeclared identifier", symbol->getName().c_str(), extraInfoFormat);

        // Add to symbol table to prevent future error messages on the same name
        if (symbol->getName().size() > 0) {
            TVariable* fakeVariable = new TVariable(&symbol->getName(), TType(EbtFloat));
            symbolTable.insert(*fakeVariable);

            // substitute a symbol node for this new variable
            nodePtr = intermediate.addSymbol(*fakeVariable, symbol->getLoc());
        }
    } else {
        switch (symbol->getQualifier().storage) {
        case EvqPointCoord:
            profileRequires(symbol->getLoc(), ENoProfile, 120, nullptr, "gl_PointCoord");
            break;
        default: break; // some compilers want this
        }
    }
}